

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODITFReader.cpp
# Opt level: O3

Barcode * __thiscall
ZXing::OneD::ITFReader::decodePattern
          (Barcode *__return_storage_ptr__,ITFReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  ushort uVar4;
  Iterator puVar5;
  bool bVar6;
  char cVar7;
  ushort *puVar8;
  BarAndSpace<int> *pBVar9;
  Iterator puVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  ulong uVar14;
  Iterator puVar15;
  bool bVar16;
  int iVar17;
  double dVar18;
  anon_class_16_2_7a905435 isGuard;
  uint local_f4;
  string txt;
  BarAndSpace<int> numWide;
  BarAndSpaceI threshold;
  BarAndSpace<int> digits;
  int iStack_b0;
  undefined4 uStack_ac;
  int local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined1 uStack_9c;
  undefined2 uStack_9b;
  undefined1 uStack_99;
  undefined7 local_98;
  undefined1 uStack_91;
  undefined2 uStack_90;
  undefined1 uStack_8e;
  undefined5 uStack_8d;
  ITFReader *local_88;
  Error local_80;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [13];
  undefined2 local_33;
  undefined1 local_31;
  
  isGuard.minQuietZone = 10.0;
  isGuard.pattern = (FixedPattern<4,_4,_false> *)param_3;
  local_88 = this;
  FindLeftGuard<4,ZXing::FindLeftGuard<4,4,false>(ZXing::PatternView_const&,int,ZXing::FixedPattern<4,4,false>const&,double)::_lambda(ZXing::PatternView_const&,int)_1_>
            ((PatternView *)&digits,(ZXing *)next,(PatternView *)&DAT_0000000a,0x197250,isGuard);
  *(int *)&next->_base = local_a8;
  *(undefined4 *)((long)&next->_base + 4) = uStack_a4;
  *(undefined4 *)&next->_end = uStack_a0;
  *(uint *)((long)&next->_end + 4) = CONCAT13(uStack_99,CONCAT21(uStack_9b,uStack_9c));
  next->_data = (Iterator)digits;
  next->_size = iStack_b0;
  *(undefined4 *)&next->field_0xc = uStack_ac;
  puVar10 = next->_data;
  if (((puVar10 == (Iterator)0x0) || (puVar10 < next->_base)) ||
     (next->_end < puVar10 + next->_size)) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&txt);
  puVar10 = next->_data;
  puVar5 = next->_base;
  if (puVar5 == puVar10) {
    local_f4 = 0;
  }
  else {
    uVar12 = 0;
    puVar15 = puVar5;
    do {
      uVar12 = uVar12 + *puVar15;
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar10);
    local_f4 = (uint)uVar12;
  }
  puVar10 = puVar10 + 4;
  next->_data = puVar10;
  next->_size = 10;
  if (puVar5 <= puVar10) {
    do {
      if (next->_end < puVar10 + next->_size) break;
      threshold = RowReader::NarrowWideThreshold(next);
      if ((threshold.bar == 0) || ((uint)threshold < 0x10000)) {
        puVar10 = next->_data;
        break;
      }
      digits.bar = 0;
      digits.space = 0;
      numWide.bar = 0;
      numWide.space = 0;
      puVar10 = next->_data;
      uVar11 = 0;
      do {
        uVar12 = puVar10[uVar11];
        uVar13 = (uint)uVar11 & 1;
        uVar4 = (&threshold.bar)[uVar13];
        if ((uint)uVar4 + (uint)uVar4 < (uint)uVar12) break;
        iVar17 = 0;
        if (uVar4 < uVar12) {
          iVar17 = *(int *)(&DAT_00197280 + (uVar11 >> 1 & 0x7fffffff) * 4);
        }
        uVar14 = (ulong)(uVar13 << 2);
        piVar1 = (int *)((long)&numWide.bar + uVar14);
        *piVar1 = *piVar1 + (uint)(uVar4 < uVar12);
        piVar1 = (int *)((long)&digits.bar + uVar14);
        *piVar1 = *piVar1 + iVar17;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 10);
      if ((numWide.bar != 2) || (numWide.space != 2)) break;
      pBVar9 = &digits;
      bVar6 = true;
      do {
        bVar16 = bVar6;
        iVar17 = pBVar9->bar;
        if (iVar17 == 0xb) {
          iVar17 = 0;
        }
        ToDigit<char>(iVar17);
        std::__cxx11::string::push_back((char)&txt);
        pBVar9 = (BarAndSpace<int> *)&digits.space;
        bVar6 = false;
      } while (bVar16);
      if (next->_data == (Iterator)0x0) {
        puVar10 = (Iterator)0x0;
        break;
      }
      puVar10 = next->_data + next->_size;
      next->_data = puVar10;
    } while (next->_base <= puVar10);
  }
  next->_size = 3;
  if (((int)txt._M_string_length < 6) ||
     (puVar8 = puVar10 + 3,
     next->_end < puVar8 || (puVar10 < next->_base || puVar10 == (Iterator)0x0))) {
LAB_001637cf:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
  }
  else {
    if (puVar8 == next->_end + -1) {
      uVar13 = 0x7fffffff;
    }
    else {
      uVar13 = (uint)*puVar8;
    }
    dVar18 = IsPattern<false,3,4>(next,(FixedPattern<3,_4,_false> *)&STOP_PATTERN_1,uVar13,10.0,0.0)
    ;
    if ((dVar18 == 0.0) && (!NAN(dVar18))) {
      if (next->_data + next->_size == next->_end + -1) {
        uVar13 = 0x7fffffff;
      }
      else {
        uVar13 = (uint)next->_data[next->_size];
      }
      dVar18 = IsPattern<false,3,5>
                         (next,(FixedPattern<3,_5,_false> *)&STOP_PATTERN_2,uVar13,10.0,0.0);
      if ((dVar18 == 0.0) && (!NAN(dVar18))) goto LAB_001637cf;
    }
    if (((undefined1  [12])
         ((undefined1  [12])*(local_88->super_RowReader)._opts & (undefined1  [12])0x80) ==
         (undefined1  [12])0x0) ||
       (cVar7 = GTIN::ComputeCheckDigit<char>(&txt,true),
       cVar7 == txt._M_dataplus._M_p[txt._M_string_length - 1])) {
      uStack_8e = 0;
      uStack_8d = 0;
      local_a8 = 0;
      uStack_a4 = 0;
      uStack_a0 = 0;
      uStack_9c = 0;
      uStack_9b = 0;
      uStack_99 = 0;
      local_98 = 0;
      uStack_90 = 0xffff;
    }
    else {
      local_50 = local_40;
      local_a8._1_3_ = (uint3)local_40._1_8_;
      local_a8 = (uint)local_a8._1_3_ << 8;
      uStack_a4 = SUB84(local_40._1_8_,3);
      uStack_a0._0_1_ = SUB81(local_40._1_8_,7);
      uStack_a0._1_3_ = (undefined3)local_40._9_4_;
      uStack_9c = SUB41(local_40._9_4_,3);
      uStack_9b = local_33;
      uStack_99 = local_31;
      local_48 = 0;
      local_40[0] = 0;
      local_98 = 0x197294;
      uStack_90 = 0x42;
      uStack_8e = 2;
    }
    digits = (BarAndSpace<int>)&local_a8;
    uStack_91 = 0;
    cVar7 = GTIN::ComputeCheckDigit<char>(&txt,true);
    puVar10 = next->_base;
    if (puVar10 == next->_data + next->_size) {
      iVar17 = -1;
    }
    else {
      uVar12 = 0;
      do {
        uVar12 = uVar12 + *puVar10;
        puVar10 = puVar10 + 1;
      } while (puVar10 != next->_data + next->_size);
      iVar17 = uVar12 - 1;
    }
    cVar3 = txt._M_dataplus._M_p[txt._M_string_length - 1];
    paVar2 = &local_80._msg.field_2;
    local_80._msg._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,digits,digits);
    local_80._file._0_7_ = local_98;
    local_80._40_3_ = SUB43(CONCAT13(uStack_8e,CONCAT21(uStack_90,uStack_91)) >> 8,0);
    local_80._file._7_1_ = uStack_91;
    Result::Result(__return_storage_ptr__,&txt,rowNumber,local_f4,iVar17,ITF,
                   (SymbologyIdentifier)((uint)(cVar7 == cVar3) << 8 | 0x3049),&local_80,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._msg._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._msg._M_dataplus._M_p,local_80._msg.field_2._M_allocated_capacity + 1
                     );
    }
    if (digits != (BarAndSpace<int>)&local_a8) {
      operator_delete((void *)digits,CONCAT44(uStack_a4,local_a8) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)txt._M_dataplus._M_p != &txt.field_2) {
    operator_delete(txt._M_dataplus._M_p,
                    CONCAT71(txt.field_2._M_allocated_capacity._1_7_,txt.field_2._M_local_buf[0]) +
                    1);
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode ITFReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	const int minCharCount = 6;
	const int minQuietZone = 10;

	next = FindLeftGuard(next, 4 + minCharCount/2 + 3, START_PATTERN_, minQuietZone);
	if (!next.isValid())
		return {};

	std::string txt;
	txt.reserve(20);

	constexpr int weights[] = {1, 2, 4, 7, 0};
	int xStart = next.pixelsInFront();
	next = next.subView(4, 10);

	while (next.isValid()) {
		const auto threshold = NarrowWideThreshold(next);
		if (!threshold.isValid())
			break;

		BarAndSpace<int> digits, numWide;
		for (int i = 0; i < 10; ++i) {
			if (next[i] > threshold[i] * 2)
				break;
			numWide[i] += next[i] > threshold[i];
			digits[i] += weights[i/2] * (next[i] > threshold[i]);
		}

		if (numWide.bar != 2 || numWide.space != 2)
			break;

		for (int i = 0; i < 2; ++i)
			txt.push_back(ToDigit(digits[i] == 11 ? 0 : digits[i]));

		next.skipSymbol();
	}

	next = next.subView(0, 3);

	if (Size(txt) < minCharCount || !next.isValid())
		return {};

	if (!IsRightGuard(next, STOP_PATTERN_1, minQuietZone) && !IsRightGuard(next, STOP_PATTERN_2, minQuietZone))
		return {};

	Error error = _opts.validateITFCheckSum() && !GTIN::IsCheckDigitValid(txt) ? ChecksumError() : Error();

	// Symbology identifier ISO/IEC 16390:2007 Annex C Table C.1
	// See also GS1 General Specifications 5.1.2 Figure 5.1.2-2
	SymbologyIdentifier symbologyIdentifier = {'I', GTIN::IsCheckDigitValid(txt) ? '1' : '0'};
	
	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::ITF, symbologyIdentifier, error);
}